

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

OPAtomIndexFooter * __thiscall
ASDCP::MXF::OPAtomIndexFooter::WriteToFile
          (OPAtomIndexFooter *this,FileWriter *Writer,ui64_t duration)

{
  bool bVar1;
  int iVar2;
  ui32_t uVar3;
  ui32_t uVar4;
  PacketList *pPVar5;
  size_type sVar6;
  reference ppIVar7;
  byte_t *pbVar8;
  uint *puVar9;
  undefined8 in_RCX;
  bool bVar10;
  long local_340;
  Result_t local_2f8 [108];
  ui32_t local_28c;
  undefined1 local_288 [4];
  ui32_t write_count;
  undefined1 local_220 [8];
  UL FooterUL;
  Result_t local_1f8 [104];
  FrameBuffer local_190 [2];
  undefined1 local_128 [8];
  FrameBuffer WriteWrapper;
  InterchangeObject *object;
  IndexTableSegment *segment;
  _Self local_e0;
  iterator pl_i;
  undefined1 local_d0 [4];
  ui32_t iseg_count;
  Result_t result;
  undefined1 local_50 [4];
  ui32_t footer_size;
  FrameBuffer FooterBuffer;
  ui64_t duration_local;
  FileWriter *Writer_local;
  OPAtomIndexFooter *this_local;
  
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x49e,
                  "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter &, ui64_t)"
                 );
  }
  FooterBuffer._32_8_ = in_RCX;
  FrameBuffer::FrameBuffer((FrameBuffer *)local_50);
  pPVar5 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                     ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(Writer + 0x70));
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::size
            (&pPVar5->m_List);
  FrameBuffer::Capacity((FrameBuffer *)local_d0,(ui32_t)local_50);
  pl_i._M_node._4_4_ = 0;
  if (*(long *)(Writer + 0x140) != 0) {
    sVar6 = std::
            vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
            ::size((vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                    *)(*(long *)(Writer + 0x140) + 0x108));
    *(size_type *)(*(long *)(Writer + 0x140) + 200) = sVar6;
    *(undefined8 *)(Writer + 0x140) = 0;
  }
  pPVar5 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                     ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(Writer + 0x70));
  local_e0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
       begin(&pPVar5->m_List);
  while( true ) {
    pPVar5 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                       ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(Writer + 0x70));
    segment = (IndexTableSegment *)
              std::__cxx11::
              list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              ::end(&pPVar5->m_List);
    bVar1 = std::operator!=(&local_e0,(_Self *)&segment);
    bVar10 = false;
    if (bVar1) {
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_d0);
      bVar10 = -1 < iVar2;
    }
    if (!bVar10) break;
    ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_e0);
    if (*ppIVar7 == (InterchangeObject *)0x0) {
      local_340 = 0;
    }
    else {
      local_340 = __dynamic_cast(*ppIVar7,&InterchangeObject::typeinfo,&IndexTableSegment::typeinfo,
                                 0);
    }
    if ((local_340 != 0) &&
       (pl_i._M_node._4_4_ = pl_i._M_node._4_4_ + 1, *(int *)(Writer + 0x148) != 0)) {
      if (pl_i._M_node._4_4_ != 1) {
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
LAB_0023e160:
        Kumu::Result_t::~Result_t((Result_t *)local_d0);
        FrameBuffer::~FrameBuffer((FrameBuffer *)local_50);
        return this;
      }
      *(undefined8 *)(local_340 + 200) = FooterBuffer._32_8_;
    }
    ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_e0);
    WriteWrapper._32_8_ = *ppIVar7;
    ((InterchangeObject *)WriteWrapper._32_8_)->m_Lookup = *(IPrimerLookup **)(Writer + 0x180);
    FrameBuffer::FrameBuffer((FrameBuffer *)local_128);
    pbVar8 = FrameBuffer::Data((FrameBuffer *)local_50);
    uVar3 = FrameBuffer::Size((FrameBuffer *)local_50);
    FrameBuffer::Capacity((FrameBuffer *)local_50);
    FrameBuffer::Size((FrameBuffer *)local_50);
    FrameBuffer::SetData(local_190,local_128,(int)pbVar8 + uVar3);
    Kumu::Result_t::~Result_t((Result_t *)local_190);
    (**(code **)(*(long *)WriteWrapper._32_8_ + 0x70))(local_1f8,WriteWrapper._32_8_,local_128);
    Kumu::Result_t::operator=((Result_t *)local_d0,local_1f8);
    Kumu::Result_t::~Result_t(local_1f8);
    uVar3 = FrameBuffer::Size((FrameBuffer *)local_50);
    uVar4 = FrameBuffer::Size((FrameBuffer *)local_128);
    FrameBuffer::Size((FrameBuffer *)local_50,uVar3 + uVar4);
    FrameBuffer::~FrameBuffer((FrameBuffer *)local_128);
    FooterUL.super_Identifier<16U>._24_8_ =
         std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_e0,0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_d0);
  if (-1 < iVar2) {
    uVar3 = FrameBuffer::Size((FrameBuffer *)local_50);
    *(ulong *)(Writer + 0xa8) = (ulong)uVar3;
    pbVar8 = Dictionary::ul(*(Dictionary **)(Writer + 0x78),MDD_CompleteFooter);
    UL::UL((UL *)local_220,pbVar8);
    Partition::WriteToFile((Partition *)local_288,Writer,(UL *)duration);
    Kumu::Result_t::operator=((Result_t *)local_d0,(Result_t *)local_288);
    Kumu::Result_t::~Result_t((Result_t *)local_288);
    UL::~UL((UL *)local_220);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_d0);
  if (-1 < iVar2) {
    local_28c = 0;
    puVar9 = (uint *)FrameBuffer::RoData((FrameBuffer *)local_50);
    FrameBuffer::Size((FrameBuffer *)local_50);
    Kumu::FileWriter::Write((uchar *)local_2f8,(uint)duration,puVar9);
    Kumu::Result_t::operator=((Result_t *)local_d0,local_2f8);
    Kumu::Result_t::~Result_t(local_2f8);
    uVar3 = local_28c;
    uVar4 = FrameBuffer::Size((FrameBuffer *)local_50);
    if (uVar3 != uVar4) {
      __assert_fail("write_count == FooterBuffer.Size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x4d0,
                    "virtual ASDCP::Result_t ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter &, ui64_t)"
                   );
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_d0);
  goto LAB_0023e160;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OPAtomIndexFooter::WriteToFile(Kumu::FileWriter& Writer, ui64_t duration)
{
  assert(m_Dict);
  ASDCP::FrameBuffer FooterBuffer;
  ui32_t   footer_size = m_PacketList->m_List.size() * MaxIndexSegmentSize; // segment-count * max-segment-size
  Result_t result = FooterBuffer.Capacity(footer_size); 
  ui32_t   iseg_count = 0;

  if ( m_CurrentSegment != 0 )
    {
      m_CurrentSegment->IndexDuration = m_CurrentSegment->IndexEntryArray.size();
      m_CurrentSegment = 0;
    }

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      IndexTableSegment *segment = dynamic_cast<IndexTableSegment*>(*pl_i);

      if ( segment != 0 )
	{
	  iseg_count++;
	  if ( m_BytesPerEditUnit != 0 )
	    {
	      if ( iseg_count != 1 )
		return RESULT_STATE;

	      segment->IndexDuration = duration;
	    }
	}

      InterchangeObject* object = *pl_i;
      object->m_Lookup = m_Lookup;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(FooterBuffer.Data() + FooterBuffer.Size(),
			   FooterBuffer.Capacity() - FooterBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      FooterBuffer.Size(FooterBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      IndexByteCount = FooterBuffer.Size();
      UL FooterUL(m_Dict->ul(MDD_CompleteFooter));
      result = Partition::WriteToFile(Writer, FooterUL);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count = 0;
      result = Writer.Write(FooterBuffer.RoData(), FooterBuffer.Size(), &write_count);
      assert(write_count == FooterBuffer.Size());
    }

  return result;
}